

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_basic_operations.c
# Opt level: O0

void base_rotate_left(cpu_registers *registers,uint8_t *value_to_rotate)

{
  byte bVar1;
  _Bool _Var2;
  uint16_t result;
  uint8_t *value_to_rotate_local;
  cpu_registers *registers_local;
  
  bVar1 = *value_to_rotate << 1;
  _Var2 = get_cpu_flag(registers,'\x01');
  if (_Var2) {
    bVar1 = bVar1 | 1;
  }
  if ((*value_to_rotate & 0x80) == 0) {
    clear_cpu_flag(registers,'\x01');
  }
  else {
    set_cpu_flag(registers,'\x01');
  }
  *value_to_rotate = bVar1;
  determine_zero_flag(registers,*value_to_rotate);
  determine_negative_flag(registers,*value_to_rotate);
  return;
}

Assistant:

void base_rotate_left(cpu_registers* registers, uint8_t* value_to_rotate) {
    uint16_t result = *value_to_rotate << 1;
    if(get_cpu_flag(registers, CARRY_FLAG)) result |= 0x1;
    else result &= ~0x1;
    if(*value_to_rotate & BIT7_BITMASK) set_cpu_flag(registers, CARRY_FLAG);
    else clear_cpu_flag(registers, CARRY_FLAG);
    *value_to_rotate = result & BYTE_MASK;
    determine_zero_flag(registers, *value_to_rotate);
    determine_negative_flag(registers, *value_to_rotate);
}